

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O2

void initAlphabets(bool doAminoAcid,char *resolutionSubset,bool id_map)

{
  int i;
  uint uVar1;
  long lVar2;
  size_t sVar3;
  unsigned_long rc;
  size_t sVar4;
  
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    validFlags[lVar2] = -1;
  }
  lVar2 = 0;
  if (doAminoAcid) {
    if (id_map) {
      for (; lVar2 != 0x19; lVar2 = lVar2 + 1) {
        validFlags[(byte)"ACDEFGHIKLMNPQRSTVWYBZX?-"[lVar2]] = "ACDEFGHIKLMNPQRSTVWYBZX?-"[lVar2];
      }
    }
    else {
      for (; lVar2 != 0x19; lVar2 = lVar2 + 1) {
        validFlags[(byte)"ACDEFGHIKLMNPQRSTVWYBZX?-"[lVar2]] = (char)lVar2;
      }
    }
  }
  else {
    if (id_map) {
      for (; lVar2 != 0x12; lVar2 = lVar2 + 1) {
        validFlags[(byte)"ACGTURYSWKMBDHVN?-"[lVar2]] = "ACGTURYSWKMBDHVN?-"[lVar2];
      }
    }
    else {
      for (; lVar2 != 0x12; lVar2 = lVar2 + 1) {
        validFlags[(byte)"ACGTURYSWKMBDHVN?-"[lVar2]] = (char)lVar2;
      }
    }
    if (resolutionSubset != (char *)0x0) {
      sVar3 = strlen(resolutionSubset);
      for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
        uVar1 = toupper((int)resolutionSubset[sVar4]);
        if (3 < (long)validFlags[uVar1 & 0xff]) {
          resolveTheseAmbigs[validFlags[uVar1 & 0xff]] = '\x01';
        }
      }
    }
  }
  return;
}

Assistant:

void initAlphabets (bool doAminoAcid, char * resolutionSubset, bool id_map) {
  for (int i = 0; i < 256; i++)
    validFlags [i] = -1;
  
  if (doAminoAcid) {
    if (id_map) {
        for (unsigned int i = 0; i < strlen (ValidCharsAA); i++)
          validFlags [(unsigned char)ValidCharsAA[i]] = (unsigned char)ValidCharsAA[i];
    } else {
        for (unsigned int i = 0; i < strlen (ValidCharsAA); i++)
            validFlags [(unsigned char)ValidCharsAA[i]] = i;

    }
    
    
  } else {  
     if (id_map) {
         for (unsigned int i = 0; i < strlen (ValidChars); i++)
          validFlags [(unsigned char)ValidChars[i]] = (unsigned char)ValidChars[i];
     } else {
         for (unsigned int i = 0; i < strlen (ValidChars); i++)
             validFlags [(unsigned char)ValidChars[i]] = i;
     }
      
    if (resolutionSubset) {
      unsigned long subset_length = strlen (resolutionSubset);
      for (unsigned long rc = 0; rc < subset_length; rc++) {
        unsigned char rcc = toupper( (resolutionSubset[rc]));
        if (validFlags[rcc] > 3) {
          resolveTheseAmbigs[(unsigned char)validFlags[rcc]] = 1;
        }
      }
    }
  }
  
}